

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void try_initialize_global_cpu_info(void)

{
  if (g_cpu_info_initialized == 0) {
    initialize_global_cpu_info();
    g_cpu_info_initialized = 1;
  }
  return;
}

Assistant:

static inline void try_initialize_global_cpu_info()
{
    if (!g_cpu_info_initialized)
    {
        initialize_global_cpu_info();
        g_cpu_info_initialized = 1;
    }
}